

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.hpp
# Opt level: O0

void __thiscall
Atari2600::TIA::Missile::output_pixels
          (Missile *this,uint8_t *target,int count,uint8_t collision_identity,
          int from_horizontal_counter)

{
  int from_horizontal_counter_local;
  uint8_t collision_identity_local;
  int count_local;
  uint8_t *target_local;
  Missile *this_local;
  
  if ((this->super_HorizontalRun).pixel_position != 0) {
    if ((((this->super_HorizontalRun).field_0x1d & 1) == 0) ||
       (((this->super_HorizontalRun).field_0x1e & 1) != 0)) {
      HorizontalRun::skip_pixels(&this->super_HorizontalRun,count,from_horizontal_counter);
    }
    else {
      HorizontalRun::output_pixels
                (&this->super_HorizontalRun,target,count,collision_identity,from_horizontal_counter)
      ;
    }
  }
  return;
}

Assistant:

inline void output_pixels(uint8_t *const target, const int count, const uint8_t collision_identity, int from_horizontal_counter) {
				if(!pixel_position) return;
				if(enabled && !locked_to_player) {
					HorizontalRun::output_pixels(target, count, collision_identity, from_horizontal_counter);
				} else {
					skip_pixels(count, from_horizontal_counter);
				}
			}